

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O3

xcb_generic_iterator_t
xcb_input_change_device_key_mapping_keysyms_end(xcb_input_change_device_key_mapping_request_t *R)

{
  xcb_generic_iterator_t xVar1;
  
  xVar1.data = &R[1].major_opcode +
               (ulong)((uint)R->keysyms_per_keycode * (uint)R->keycode_count) * 4;
  xVar1._8_8_ = (ulong)(uint)((int)xVar1.data - (int)R) << 0x20;
  return xVar1;
}

Assistant:

xcb_generic_iterator_t
xcb_input_change_device_key_mapping_keysyms_end (const xcb_input_change_device_key_mapping_request_t *R)
{
    xcb_generic_iterator_t i;
    i.data = ((xcb_keysym_t *) (R + 1)) + ((R->keycode_count * R->keysyms_per_keycode));
    i.rem = 0;
    i.index = (char *) i.data - (char *) R;
    return i;
}